

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::print
          (AnimatedPerspectiveCameraNode *this,ostream *cout,int depth)

{
  int iVar1;
  ostream *poVar2;
  pointer pRVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"AnimatedPerspectiveCameraNode @ ",0x20);
  poVar2 = std::ostream::_M_insert<void_const*>(cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," { ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar1 = std::__cxx11::string::compare
                    ((char *)&(this->super_PerspectiveCameraNode).super_Node.name);
  if (iVar1 != 0) {
    if (-1 < depth) {
      iVar1 = depth + 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(cout,"name = ",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (cout,(this->super_PerspectiveCameraNode).super_Node.name._M_dataplus._M_p,
                        (this->super_PerspectiveCameraNode).super_Node.name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pRVar3 = (this->cameras).
           super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->cameras).
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar3) {
    uVar6 = 0;
    do {
      uVar5 = (ulong)(depth + 1);
      if (-1 < depth) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
          uVar4 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar4;
        } while (uVar4 != 0);
        pRVar3 = (this->cameras).
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      (*((pRVar3[uVar6].ptr)->super_Node).super_RefCount._vptr_RefCount[4])
                (pRVar3[uVar6].ptr,cout,(ulong)(depth + 1));
      uVar6 = uVar6 + 1;
      pRVar3 = (this->cameras).
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->cameras).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 3));
  }
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      depth = depth + -1;
    } while (depth != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + (char)cout);
  std::ostream::put((char)cout);
  std::ostream::flush();
  return;
}

Assistant:

void SceneGraph::AnimatedPerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "AnimatedPerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    for (size_t i=0; i<cameras.size(); i++) {
      tab(cout,depth+1); cameras[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }